

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O2

void malloc_mutex_lock(tsdn_t *tsdn,malloc_mutex_t *mutex)

{
  int iVar1;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&tsd_nominal_tsds_lock.field_0 + 0x40));
  if (iVar1 != 0) {
    malloc_mutex_lock_slow(&tsd_nominal_tsds_lock);
    tsd_nominal_tsds_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  tsd_nominal_tsds_lock.field_0.field_0.prof_data.n_lock_ops =
       tsd_nominal_tsds_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (tsd_nominal_tsds_lock.field_0.field_0.prof_data.prev_owner != tsdn) {
    tsd_nominal_tsds_lock.field_0.witness.link.qre_prev =
         (witness_t *)(tsd_nominal_tsds_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    tsd_nominal_tsds_lock.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  return;
}

Assistant:

static inline void
malloc_mutex_lock(tsdn_t *tsdn, malloc_mutex_t *mutex) {
	witness_assert_not_owner(tsdn_witness_tsdp_get(tsdn), &mutex->witness);
	if (isthreaded) {
		if (malloc_mutex_trylock_final(mutex)) {
			malloc_mutex_lock_slow(mutex);
			atomic_store_b(&mutex->locked, true, ATOMIC_RELAXED);
		}
		mutex_owner_stats_update(tsdn, mutex);
	}
	witness_lock(tsdn_witness_tsdp_get(tsdn), &mutex->witness);
}